

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall Clasp::MinimizeBuilder::CmpWeight::operator()(CmpWeight *this,MLit *lhs,MLit *rhs)

{
  int iVar1;
  int iVar2;
  byte bVar4;
  pointer pLVar3;
  pointer pLVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  uVar6 = lhs->weight;
  if (this->weights == (WeightVec *)0x0) {
    uVar7 = rhs->weight;
    bVar10 = SBORROW4(uVar6,uVar7);
    bVar9 = (int)(uVar6 - uVar7) < 0;
    bVar8 = uVar6 == uVar7;
  }
  else {
    pLVar3 = (this->weights->ebo_).buf;
    pLVar5 = pLVar3 + uVar6;
    pLVar3 = pLVar3 + (uint)rhs->weight;
    uVar6 = *(uint *)pLVar5;
    uVar7 = *(uint *)pLVar3;
    while( true ) {
      if ((uVar6 & 0x7fffffff) != (uVar7 & 0x7fffffff)) break;
      iVar1 = pLVar3->weight;
      iVar2 = pLVar5->weight;
      bVar10 = SBORROW4(iVar2,iVar1);
      bVar9 = iVar2 - iVar1 < 0;
      bVar8 = iVar2 == iVar1;
      if (!bVar8) goto LAB_0015193d;
      if (-1 < (int)uVar6) {
        if (-1 < (int)uVar7) {
          return false;
        }
        bVar4 = (byte)((uint)pLVar3[1].weight >> 0x18);
        goto LAB_00151944;
      }
      if (-1 < (int)uVar7) {
        bVar10 = false;
        bVar9 = pLVar5[1].weight < 0;
        bVar8 = pLVar5[1].weight == 0;
        goto LAB_0015193d;
      }
      uVar6 = *(uint *)(pLVar5 + 1);
      pLVar5 = pLVar5 + 1;
      uVar7 = *(uint *)(pLVar3 + 1);
      pLVar3 = pLVar3 + 1;
    }
    if ((uVar7 & 0x7fffffff) <= (uVar6 & 0x7fffffff)) {
      bVar4 = (byte)((uint)pLVar3->weight >> 0x18);
LAB_00151944:
      return (bool)(bVar4 >> 7);
    }
    bVar10 = false;
    bVar9 = pLVar5->weight < 0;
    bVar8 = pLVar5->weight == 0;
  }
LAB_0015193d:
  return !bVar8 && bVar10 == bVar9;
}

Assistant:

bool MinimizeBuilder::CmpWeight::operator()(const MLit& lhs, const MLit& rhs) const {
	if (!weights) { return lhs.weight > rhs.weight; }
	const SharedData::LevelWeight* wLhs = &(*weights)[lhs.weight];
	const SharedData::LevelWeight* wRhs = &(*weights)[rhs.weight];
	for (;; ++wLhs, ++wRhs) {
		if (wLhs->level != wRhs->level)  {
			return wLhs->level < wRhs->level ? wLhs->weight > 0 : 0 > wRhs->weight;
		}
		if (wLhs->weight != wRhs->weight){ return wLhs->weight > wRhs->weight; }
		if (!wLhs->next) { return wRhs->next && (++wRhs)->weight < 0; }
		if (!wRhs->next) { ++wLhs; break; }
	}
	return wLhs->weight > 0;
}